

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O0

Complex __thiscall libDAI::TRW::logZ(TRW *this)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  long *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Complex CVar10;
  Var v_j;
  size_t j;
  Var v_i;
  size_t i;
  size_t in_stack_00000200;
  TRW *in_stack_00000208;
  size_t I;
  Real sum;
  TFactor<double> *in_stack_fffffffffffffdb0;
  Var *in_stack_fffffffffffffdb8;
  VarSet *in_stack_fffffffffffffdc0;
  undefined1 *i_00;
  undefined7 in_stack_fffffffffffffdd0;
  VarSet local_1d0;
  undefined1 local_1b0 [56];
  undefined1 local_178 [32];
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  TFactor<double> *in_stack_fffffffffffffed0;
  TFactor<double> *in_stack_fffffffffffffed8;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong local_e8;
  TFactor<double> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffffa0;
  TRW *in_stack_ffffffffffffffa8;
  ulong local_28;
  double local_20;
  complex<double> local_10;
  
  local_20 = 0.0;
  local_28 = 0;
  auVar7._0_8_ = in_stack_fffffffffffffdb0;
  while( true ) {
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    uVar3 = (**(code **)(*plVar2 + 0x48))();
    if (uVar3 <= local_28) break;
    beliefF(in_stack_00000208,in_stack_00000200);
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    dVar6 = (double)(**(code **)(*plVar2 + 0x50))(plVar2,local_28);
    TFactor<double>::log((TFactor<double> *)&stack0xffffffffffffff30,dVar6);
    TFactor<double>::operator*(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    dVar6 = TFactor<double>::totalSum((TFactor<double> *)0xba76df);
    local_20 = dVar6 + local_20;
    TFactor<double>::~TFactor(auVar7._0_8_);
    TFactor<double>::~TFactor(auVar7._0_8_);
    TFactor<double>::~TFactor(auVar7._0_8_);
    local_28 = local_28 + 1;
  }
  local_e8 = 0;
  while( true ) {
    uVar3 = local_e8;
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    uVar4 = (**(code **)(*plVar2 + 0x28))();
    if (uVar4 <= uVar3) break;
    plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
    puVar5 = (undefined8 *)(**(code **)(*plVar2 + 0x30))(plVar2,local_e8);
    local_f8 = *puVar5;
    uStack_f0 = puVar5[1];
    beliefV(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    TFactor<double>::entropy((TFactor<double> *)0xba784a);
    dVar6 = std::real<double>((complex<double> *)0xba7883);
    local_20 = dVar6 + local_20;
    TFactor<double>::~TFactor(auVar7._0_8_);
    local_148 = local_e8;
    while( true ) {
      local_148 = local_148 + 1;
      uVar3 = local_148;
      plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
      uVar4 = (**(code **)(*plVar2 + 0x28))();
      if (uVar4 <= uVar3) break;
      plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
      puVar5 = (undefined8 *)(**(code **)(*plVar2 + 0x30))(plVar2,local_148);
      local_158 = *puVar5;
      uStack_150 = puVar5[1];
      plVar2 = (long *)(**(code **)(*in_RDI + 0x20))();
      i_00 = local_178;
      (**(code **)(*plVar2 + 0x70))(i_00,plVar2,&local_f8);
      bVar1 = VarSet::operator&&(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      VarSet::~VarSet((VarSet *)0xba7982);
      if ((bVar1 & 1) != 0) {
        in_stack_fffffffffffffdb8 =
             (Var *)rho((TRW *)CONCAT17(bVar1,in_stack_fffffffffffffdd0),(size_t)i_00,
                        (size_t)in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffdc0 = &local_1d0;
        libDAI::operator|(in_stack_fffffffffffffdb8,(Var *)auVar7._0_8_);
        (**(code **)(*in_RDI + 0x58))(local_1b0,in_RDI,in_stack_fffffffffffffdc0);
        auVar7._0_8_ = (TFactor<double> *)MutualInfo<double>(in_stack_ffffffffffffff60);
        auVar7._8_8_ = 0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_20;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (ulong)in_stack_fffffffffffffdb8 ^ 0x8000000000000000;
        auVar8 = vfmadd213sd_fma(auVar7,auVar8,auVar9);
        local_20 = auVar8._0_8_;
        TFactor<double>::~TFactor(auVar7._0_8_);
        VarSet::~VarSet((VarSet *)0xba7a5d);
      }
    }
    local_e8 = local_e8 + 1;
  }
  std::complex<double>::complex(&local_10,local_20,0.0);
  CVar10._M_value._8_8_ = extraout_RDX;
  CVar10._M_value._0_8_ = extraout_RAX;
  return (Complex)CVar10._M_value;
}

Assistant:

Complex TRW::logZ() const {
/*        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;*/

        Real sum = 0.0;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum += (beliefF(I) * grm().factor(I).log()).totalSum();
        for( size_t i = 0; i < grm().nrVars(); i++ ) {
            Var v_i = grm().var(i);
            sum += real(beliefV(i).entropy());
            for( size_t j = i+1; j < grm().nrVars(); j++ ) {
                Var v_j = grm().var(j);
                if( grm().delta(v_i) && v_j )
                    sum -= rho(i,j) * MutualInfo( belief( v_i | v_j ) );
            }
        }
        return sum;
    }